

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O0

void __thiscall
baryonyx::itm::quadratic_cost_type<float>::make_l2_norm(quadratic_cost_type<float> *this,int n)

{
  float fVar1;
  int iVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  type pfVar5;
  type piVar6;
  type pqVar7;
  int local_2c;
  int e_1;
  int i_3;
  int i_2;
  int e;
  int i_1;
  int i;
  float div;
  int n_local;
  quadratic_cost_type<float> *this_local;
  
  i_1 = 0;
  for (e = 0; e != n; e = e + 1) {
    pfVar5 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                       (&this->linear_elements,(long)e);
    fVar1 = *pfVar5;
    pfVar5 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                       (&this->linear_elements,(long)e);
    auVar3 = vfmadd213ss_fma(ZEXT416((uint)*pfVar5),ZEXT416((uint)fVar1),ZEXT416((uint)i_1));
    i_1 = auVar3._0_4_;
  }
  i_2 = 0;
  piVar6 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[](&this->indices,(long)n);
  iVar2 = *piVar6;
  for (; i_2 != iVar2; i_2 = i_2 + 1) {
    pqVar7 = std::
             unique_ptr<baryonyx::itm::quadratic_cost_type<float>::quad[],_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
             ::operator[](&this->quadratic_elements,(long)i_2);
    fVar1 = pqVar7->factor;
    pqVar7 = std::
             unique_ptr<baryonyx::itm::quadratic_cost_type<float>::quad[],_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
             ::operator[](&this->quadratic_elements,(long)i_2);
    auVar3 = vfmadd213ss_fma(ZEXT416((uint)pqVar7->factor),ZEXT416((uint)fVar1),ZEXT416((uint)i_1));
    i_1 = auVar3._0_4_;
  }
  bVar4 = std::isnormal((float)i_1);
  if (bVar4) {
    for (e_1 = 0; e_1 != n; e_1 = e_1 + 1) {
      pfVar5 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                         (&this->linear_elements,(long)e_1);
      *pfVar5 = *pfVar5 / (float)i_1;
    }
    local_2c = 0;
    piVar6 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[](&this->indices,(long)n)
    ;
    iVar2 = *piVar6;
    for (; local_2c != iVar2; local_2c = local_2c + 1) {
      pqVar7 = std::
               unique_ptr<baryonyx::itm::quadratic_cost_type<float>::quad[],_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
               ::operator[](&this->quadratic_elements,(long)local_2c);
      pqVar7->factor = pqVar7->factor / (float)i_1;
    }
  }
  return;
}

Assistant:

void make_l2_norm(int n)
    {
        Float div = { 0 };

        for (int i = 0; i != n; ++i)
            div += linear_elements[i] * linear_elements[i];
        ;

        for (int i = 0, e = indices[n]; i != e; ++i)
            div += quadratic_elements[i].factor * quadratic_elements[i].factor;

        if (std::isnormal(div)) {
            for (int i = 0; i != n; ++i)
                linear_elements[i] /= div;

            for (int i = 0, e = indices[n]; i != e; ++i)
                quadratic_elements[i].factor /= div;
        }
    }